

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

void __thiscall
cppcms::impl::details::
intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::container>
::insert_after(intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::container>
               *this,container *p,container *after_me)

{
  container *pcVar1;
  
  pcVar1 = after_me->next;
  if (pcVar1 == (container *)0x0) {
    p->next = (container *)0x0;
    pcVar1 = this->end;
    p->prev = pcVar1;
    if (pcVar1 != (container *)0x0) {
      pcVar1->next = p;
    }
    this->end = p;
    if (this->begin != (container *)0x0) {
      return;
    }
  }
  else {
    this = (intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::container>
            *)&after_me->next;
    p->prev = after_me;
    p->next = pcVar1;
    if (after_me->next != (container *)0x0) {
      after_me->next->prev = p;
    }
  }
  this->begin = p;
  return;
}

Assistant:

void insert_after(T *p,T *after_me)
	{
		if(!after_me->next) {
			push_back(p);
			return;
		}
		p->prev = after_me;
		p->next = after_me->next;
		if(after_me->next)
			after_me->next->prev = p;
		after_me->next = p;
	}